

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteExprList(BinaryWriter *this,Func *func,ExprList *exprs)

{
  Module *pMVar1;
  pointer pVVar2;
  pointer pTVar3;
  bool bVar4;
  byte bVar5;
  Index IVar6;
  uint32_t value;
  Index IVar7;
  reference base;
  VarExpr<(wabt::ExprType)50> *pVVar8;
  SimdShuffleOpExpr *pSVar9;
  VarExpr<(wabt::ExprType)53> *pVVar10;
  VarExpr<(wabt::ExprType)47> *pVVar11;
  IfExpr *pIVar12;
  VarExpr<(wabt::ExprType)35> *pVVar13;
  RefTypeExpr<(wabt::ExprType)36> *pRVar14;
  ConstExpr *pCVar15;
  LoadStoreExpr<(wabt::ExprType)44> *pLVar16;
  CallIndirectExpr *pCVar17;
  TableInitExpr *pTVar18;
  BrOnExnExpr *pBVar19;
  VarExpr<(wabt::ExprType)49> *pVVar20;
  ReturnCallIndirectExpr *pRVar21;
  BrTableExpr *pBVar22;
  ulong uVar23;
  char *pcVar24;
  VarExpr<(wabt::ExprType)25> *pVVar25;
  VarExpr<(wabt::ExprType)24> *pVVar26;
  OpcodeExpr<(wabt::ExprType)7> *pOVar27;
  VarExpr<(wabt::ExprType)31> *pVVar28;
  SelectExpr *pSVar29;
  VarExpr<(wabt::ExprType)20> *pVVar30;
  AtomicFenceExpr *pAVar31;
  VarExpr<(wabt::ExprType)13> *pVVar32;
  LoadStoreExpr<(wabt::ExprType)0> *pLVar33;
  VarExpr<(wabt::ExprType)10> *pVVar34;
  BlockExprBase<(wabt::ExprType)8> *pBVar35;
  LoadStoreExpr<(wabt::ExprType)45> *pLVar36;
  Address AVar37;
  VarExpr<(wabt::ExprType)39> *pVVar38;
  VarExpr<(wabt::ExprType)19> *pVVar39;
  OpcodeExpr<(wabt::ExprType)15> *pOVar40;
  SimdLaneOpExpr *pSVar41;
  VarExpr<(wabt::ExprType)23> *pVVar42;
  VarExpr<(wabt::ExprType)28> *pVVar43;
  BlockExprBase<(wabt::ExprType)26> *pBVar44;
  VarExpr<(wabt::ExprType)55> *pVVar45;
  char *pcVar46;
  VarExpr<(wabt::ExprType)52> *pVVar47;
  TableCopyExpr *pTVar48;
  VarExpr<(wabt::ExprType)51> *pVVar49;
  RelocType reloc_type;
  int __c;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c_00;
  int __c_01;
  undefined8 uVar50;
  undefined8 extraout_RDX;
  undefined8 uVar51;
  undefined8 extraout_RDX_00;
  Var *var_00;
  Var *var_01;
  Var *var_02;
  ExprList *exprs_00;
  Var *var;
  pointer this_00;
  Stream *pSVar52;
  Opcode OVar53;
  pointer pTVar54;
  const_iterator rhs;
  v128 value_00;
  const_iterator __begin2;
  
  __begin2.node_ = exprs->first_;
  __begin2.list_ = exprs;
  do {
    rhs.node_ = (Expr *)0x0;
    rhs.list_ = exprs;
    bVar4 = intrusive_list<wabt::Expr>::const_iterator::operator!=(&__begin2,rhs);
    if (!bVar4) {
      return;
    }
    base = intrusive_list<wabt::Expr>::const_iterator::operator*(&__begin2);
    switch(base->type_) {
    case AtomicLoad:
      pLVar33 = cast<wabt::LoadStoreExpr<(wabt::ExprType)0>,wabt::Expr>(base);
      goto LAB_0013b2f7;
    case AtomicRmw:
      pLVar33 = (LoadStoreExpr<(wabt::ExprType)0> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)1>,wabt::Expr>(base);
      goto LAB_0013b2f7;
    case AtomicRmwCmpxchg:
      pLVar33 = (LoadStoreExpr<(wabt::ExprType)0> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)2>,wabt::Expr>(base);
      goto LAB_0013b2f7;
    case AtomicStore:
      pLVar33 = (LoadStoreExpr<(wabt::ExprType)0> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)3>,wabt::Expr>(base);
      goto LAB_0013b2f7;
    case AtomicNotify:
      pLVar33 = (LoadStoreExpr<(wabt::ExprType)0> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)4>,wabt::Expr>(base);
      goto LAB_0013b2f7;
    case AtomicFence:
      pAVar31 = cast<wabt::AtomicFenceExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)0x196);
      pSVar52 = this->stream_;
      value = pAVar31->consistency_model;
      pcVar46 = "consistency model";
      goto LAB_0013b682;
    case AtomicWait:
      pLVar33 = (LoadStoreExpr<(wabt::ExprType)0> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)6>,wabt::Expr>(base);
LAB_0013b2f7:
      WriteOpcode(this->stream_,(Opcode)(pLVar33->opcode).enum_);
      AVar37 = Opcode::GetAlignment(&pLVar33->opcode,pLVar33->align);
      pSVar52 = this->stream_;
      bVar5 = log2_u32((uint32_t)AVar37);
      Stream::WriteU8(pSVar52,(uint)bVar5,"alignment",No);
      pSVar52 = this->stream_;
      value = (uint32_t)pLVar33->offset;
      pcVar46 = "memory offset";
      goto LAB_0013b682;
    case Binary:
      pSVar52 = this->stream_;
      pOVar27 = cast<wabt::OpcodeExpr<(wabt::ExprType)7>,wabt::Expr>(base);
      OVar53.enum_ = (pOVar27->opcode).enum_;
      goto LAB_0013b64d;
    case Block:
      WriteOpcode(this->stream_,(Opcode)0x2);
      pBVar35 = cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(base);
      WriteBlockDecl(this,&(pBVar35->block).decl);
      pBVar44 = (BlockExprBase<(wabt::ExprType)26> *)
                cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(base);
      goto LAB_0013b622;
    case Br:
      pcVar46 = (char *)0xc;
      WriteOpcode(this->stream_,(Opcode)0xc);
      pSVar52 = this->stream_;
      pVVar34 = (VarExpr<(wabt::ExprType)10> *)
                cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(base);
      __c_00 = extraout_EDX;
      goto LAB_0013b36a;
    case BrIf:
      pcVar46 = (char *)0xd;
      WriteOpcode(this->stream_,(Opcode)0xd);
      pSVar52 = this->stream_;
      pVVar34 = cast<wabt::VarExpr<(wabt::ExprType)10>,wabt::Expr>(base);
      __c_00 = extraout_EDX_00;
LAB_0013b36a:
      pcVar46 = Var::index(&pVVar34->var,pcVar46,__c_00);
      value = (uint32_t)pcVar46;
      pcVar46 = "break depth";
      goto LAB_0013b682;
    case BrOnExn:
      pBVar19 = cast<wabt::BrOnExnExpr,wabt::Expr>(base);
      pcVar46 = (char *)0xa;
      WriteOpcode(this->stream_,(Opcode)0xa);
      pSVar52 = this->stream_;
      pcVar46 = Var::index(&pBVar19->label_var,pcVar46,__c);
      WriteU32Leb128(pSVar52,(uint32_t)pcVar46,"break depth");
      pSVar52 = this->stream_;
      value = Module::GetEventIndex(this->module_,&pBVar19->event_var);
      pcVar46 = "event index";
      goto LAB_0013b682;
    case BrTable:
      pBVar22 = cast<wabt::BrTableExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)0xe);
      uVar23 = ((long)(pBVar22->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(pBVar22->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x48;
      pcVar46 = (char *)(uVar23 & 0xffffffff);
      WriteU32Leb128(this->stream_,(uint32_t)uVar23,"num targets");
      pVVar2 = (pBVar22->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar51 = extraout_RDX;
      for (this_00 = (pBVar22->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
                     _M_impl.super__Vector_impl_data._M_start; this_00 != pVVar2;
          this_00 = this_00 + 1) {
        pcVar24 = Var::index(this_00,pcVar46,(int)uVar51);
        pcVar46 = (char *)((ulong)pcVar24 & 0xffffffff);
        WriteU32Leb128(this->stream_,(uint32_t)pcVar24,"break depth");
        uVar51 = extraout_RDX_00;
      }
      pcVar46 = Var::index(&pBVar22->default_target,pcVar46,(int)uVar51);
      WriteU32Leb128(this->stream_,(uint32_t)pcVar46,"break depth for default");
      break;
    case Call:
      pMVar1 = this->module_;
      pVVar32 = cast<wabt::VarExpr<(wabt::ExprType)13>,wabt::Expr>(base);
      IVar6 = Module::GetFuncIndex(pMVar1,&pVVar32->var);
      pSVar52 = this->stream_;
      OVar53.enum_ = Call;
      goto LAB_0013b4b3;
    case CallIndirect:
      pMVar1 = this->module_;
      pCVar17 = cast<wabt::CallIndirectExpr,wabt::Expr>(base);
      IVar7 = Module::GetFuncTypeIndex(pMVar1,&pCVar17->decl);
      pMVar1 = this->module_;
      pCVar17 = cast<wabt::CallIndirectExpr,wabt::Expr>(base);
      IVar6 = Module::GetTableIndex(pMVar1,&pCVar17->table);
      pSVar52 = this->stream_;
      OVar53.enum_ = CallIndirect;
      goto LAB_0013aff6;
    case Compare:
      pSVar52 = this->stream_;
      pOVar40 = cast<wabt::OpcodeExpr<(wabt::ExprType)15>,wabt::Expr>(base);
      goto LAB_0013b647;
    case Const:
      pCVar15 = cast<wabt::ConstExpr,wabt::Expr>(base);
      switch((pCVar15->const_).type_.enum_) {
      case V128:
        WriteOpcode(this->stream_,(Opcode)0xe1);
        pSVar52 = this->stream_;
        uVar51 = *(undefined8 *)(pCVar15->const_).data_.v;
        uVar50 = *(undefined8 *)((pCVar15->const_).data_.v + 8);
        pcVar46 = "v128 literal";
        goto LAB_0013acad;
      case F64:
        WriteOpcode(this->stream_,(Opcode)0x38);
        Stream::WriteU64(this->stream_,*(uint64_t *)(pCVar15->const_).data_.v,"f64 literal",No);
        break;
      case F32:
        WriteOpcode(this->stream_,(Opcode)0x37);
        Stream::WriteU32(this->stream_,*(uint32_t *)(pCVar15->const_).data_.v,"f32 literal",No);
        break;
      case I64:
        WriteOpcode(this->stream_,(Opcode)0x36);
        WriteS64Leb128(this->stream_,*(uint64_t *)(pCVar15->const_).data_.v,"i64 literal");
        break;
      case I32:
        WriteOpcode(this->stream_,(Opcode)0x35);
        WriteS32Leb128(this->stream_,*(uint32_t *)(pCVar15->const_).data_.v,"i32 literal");
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/binary-writer.cc"
                      ,0x308,
                      "void wabt::(anonymous namespace)::BinaryWriter::WriteExpr(const Func *, const Expr *)"
                     );
      }
      break;
    case Convert:
      pSVar52 = this->stream_;
      pOVar40 = (OpcodeExpr<(wabt::ExprType)15> *)
                cast<wabt::OpcodeExpr<(wabt::ExprType)17>,wabt::Expr>(base);
      goto LAB_0013b647;
    case Drop:
      pSVar52 = this->stream_;
      OVar53.enum_ = Drop;
      goto LAB_0013b64d;
    case GlobalGet:
      pMVar1 = this->module_;
      pVVar39 = cast<wabt::VarExpr<(wabt::ExprType)19>,wabt::Expr>(base);
      IVar6 = Module::GetGlobalIndex(pMVar1,&pVVar39->var);
      pSVar52 = this->stream_;
      OVar53.enum_ = GlobalGet;
      goto LAB_0013b4ec;
    case GlobalSet:
      pMVar1 = this->module_;
      pVVar30 = cast<wabt::VarExpr<(wabt::ExprType)20>,wabt::Expr>(base);
      IVar6 = Module::GetGlobalIndex(pMVar1,&pVVar30->var);
      pSVar52 = this->stream_;
      OVar53.enum_ = GlobalSet;
LAB_0013b4ec:
      WriteOpcode(pSVar52,OVar53);
      pcVar46 = "global.get global index";
      reloc_type = GlobalIndexLEB;
      goto LAB_0013b505;
    case If:
      pIVar12 = cast<wabt::IfExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)0x4);
      WriteBlockDecl(this,&(pIVar12->true_).decl);
      WriteExprList(this,func,&(pIVar12->true_).exprs);
      if ((pIVar12->false_).size_ != 0) {
        WriteOpcode(this->stream_,(Opcode)0x5);
        goto LAB_0013b2bd;
      }
      goto LAB_0013b634;
    case Load:
      pLVar16 = (LoadStoreExpr<(wabt::ExprType)44> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)22>,wabt::Expr>(base);
      goto LAB_0013b445;
    case LocalGet:
      pVVar42 = cast<wabt::VarExpr<(wabt::ExprType)23>,wabt::Expr>(base);
      value = GetLocalIndex((BinaryWriter *)func,(Func *)&pVVar42->var,var_02);
      pSVar52 = this->stream_;
      OVar53.enum_ = LocalGet;
      goto LAB_0013b572;
    case LocalSet:
      pVVar26 = cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(base);
      value = GetLocalIndex((BinaryWriter *)func,(Func *)&pVVar26->var,var_01);
      pSVar52 = this->stream_;
      OVar53.enum_ = LocalSet;
      goto LAB_0013b572;
    case LocalTee:
      pVVar25 = cast<wabt::VarExpr<(wabt::ExprType)25>,wabt::Expr>(base);
      value = GetLocalIndex((BinaryWriter *)func,(Func *)&pVVar25->var,var_00);
      pSVar52 = this->stream_;
      OVar53.enum_ = LocalTee;
LAB_0013b572:
      WriteOpcode(pSVar52,OVar53);
      pSVar52 = this->stream_;
      pcVar46 = "local index";
      goto LAB_0013b682;
    case Loop:
      WriteOpcode(this->stream_,(Opcode)0x3);
      pBVar44 = cast<wabt::BlockExprBase<(wabt::ExprType)26>,wabt::Expr>(base);
      WriteBlockDecl(this,&(pBVar44->block).decl);
      pBVar44 = cast<wabt::BlockExprBase<(wabt::ExprType)26>,wabt::Expr>(base);
LAB_0013b622:
      exprs_00 = &(pBVar44->block).exprs;
LAB_0013b62f:
      WriteExprList(this,func,exprs_00);
LAB_0013b634:
      pSVar52 = this->stream_;
      OVar53.enum_ = End;
      goto LAB_0013b64d;
    case MemoryCopy:
      WriteOpcode(this->stream_,(Opcode)0xc8);
      WriteU32Leb128(this->stream_,0,"memory.copy reserved");
      pSVar52 = this->stream_;
      value = 0;
      pcVar46 = "memory.copy reserved";
      goto LAB_0013b682;
    case DataDrop:
      pMVar1 = this->module_;
      pVVar43 = cast<wabt::VarExpr<(wabt::ExprType)28>,wabt::Expr>(base);
      IVar6 = Module::GetDataSegmentIndex(pMVar1,&pVVar43->var);
      WriteOpcode(this->stream_,(Opcode)0xc7);
      pSVar52 = this->stream_;
      pcVar46 = "data.drop segment";
      goto LAB_0013b5c4;
    case MemoryFill:
      WriteOpcode(this->stream_,(Opcode)0xc9);
      pSVar52 = this->stream_;
      pcVar46 = "memory.fill reserved";
      goto LAB_0013b5ed;
    case MemoryGrow:
      WriteOpcode(this->stream_,(Opcode)0x34);
      pSVar52 = this->stream_;
      pcVar46 = "memory.grow reserved";
      goto LAB_0013b5ed;
    case MemoryInit:
      pMVar1 = this->module_;
      pVVar28 = cast<wabt::VarExpr<(wabt::ExprType)31>,wabt::Expr>(base);
      IVar6 = Module::GetDataSegmentIndex(pMVar1,&pVVar28->var);
      WriteOpcode(this->stream_,(Opcode)0xc6);
      WriteU32Leb128(this->stream_,IVar6,"memory.init segment");
      pSVar52 = this->stream_;
      pcVar46 = "memory.init reserved";
      IVar6 = 0;
LAB_0013b5c4:
      WriteU32Leb128(pSVar52,IVar6,pcVar46);
      this->has_data_segment_instruction_ = true;
      break;
    case MemorySize:
      WriteOpcode(this->stream_,(Opcode)0x33);
      pSVar52 = this->stream_;
      pcVar46 = "memory.size reserved";
LAB_0013b5ed:
      value = 0;
      goto LAB_0013b682;
    case Nop:
      pSVar52 = this->stream_;
      OVar53.enum_ = Nop;
      goto LAB_0013b64d;
    case RefIsNull:
      pSVar52 = this->stream_;
      OVar53.enum_ = RefIsNull;
      goto LAB_0013b64d;
    case RefFunc:
      WriteOpcode(this->stream_,(Opcode)0xd4);
      pMVar1 = this->module_;
      pVVar13 = cast<wabt::VarExpr<(wabt::ExprType)35>,wabt::Expr>(base);
      IVar6 = Module::GetFuncIndex(pMVar1,&pVVar13->var);
      goto LAB_0013b4c9;
    case RefNull:
      WriteOpcode(this->stream_,(Opcode)0xd2);
      pSVar52 = this->stream_;
      pRVar14 = cast<wabt::RefTypeExpr<(wabt::ExprType)36>,wabt::Expr>(base);
      WriteType(pSVar52,(Type)(pRVar14->type).enum_,"ref.null type");
      break;
    case Rethrow:
      pSVar52 = this->stream_;
      OVar53.enum_ = Rethrow;
      goto LAB_0013b64d;
    case Return:
      pSVar52 = this->stream_;
      OVar53.enum_ = Return;
      goto LAB_0013b64d;
    case ReturnCall:
      pMVar1 = this->module_;
      pVVar38 = cast<wabt::VarExpr<(wabt::ExprType)39>,wabt::Expr>(base);
      IVar6 = Module::GetFuncIndex(pMVar1,&pVVar38->var);
      pSVar52 = this->stream_;
      OVar53.enum_ = ReturnCall;
LAB_0013b4b3:
      WriteOpcode(pSVar52,OVar53);
LAB_0013b4c9:
      pcVar46 = "block type function index";
      reloc_type = First;
LAB_0013b505:
      WriteU32Leb128WithReloc(this,IVar6,pcVar46 + 0xb,reloc_type);
      break;
    case ReturnCallIndirect:
      pMVar1 = this->module_;
      pRVar21 = cast<wabt::ReturnCallIndirectExpr,wabt::Expr>(base);
      IVar7 = Module::GetFuncTypeIndex(pMVar1,&pRVar21->decl);
      pMVar1 = this->module_;
      pRVar21 = cast<wabt::ReturnCallIndirectExpr,wabt::Expr>(base);
      IVar6 = Module::GetTableIndex(pMVar1,&pRVar21->table);
      pSVar52 = this->stream_;
      OVar53.enum_ = ReturnCallIndirect;
LAB_0013aff6:
      WriteOpcode(pSVar52,OVar53);
      WriteU32Leb128WithReloc(this,IVar7,"signature index",TypeIndexLEB);
      pcVar46 = "table index";
      goto LAB_0013b757;
    case Select:
      pSVar29 = cast<wabt::SelectExpr,wabt::Expr>(base);
      pSVar52 = this->stream_;
      if ((pSVar29->result_type).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
          .super__Vector_impl_data._M_start ==
          (pSVar29->result_type).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        OVar53.enum_ = Select;
        goto LAB_0013b64d;
      }
      WriteOpcode(pSVar52,(Opcode)0x16);
      WriteU32Leb128(this->stream_,
                     (uint32_t)
                     ((ulong)((long)(pSVar29->result_type).
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(pSVar29->result_type).
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2),
                     "num result types");
      pTVar3 = (pSVar29->result_type).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pTVar54 = (pSVar29->result_type).
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_start; pTVar54 != pTVar3; pTVar54 = pTVar54 + 1) {
        WriteType(this->stream_,(Type)pTVar54->enum_,"result type");
      }
      break;
    case SimdLaneOp:
      pSVar41 = cast<wabt::SimdLaneOpExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)(pSVar41->opcode).enum_);
      pSVar52 = this->stream_;
      pSVar41 = cast<wabt::SimdLaneOpExpr,wabt::Expr>(base);
      Stream::WriteU8(pSVar52,(uint)(byte)pSVar41->val,"Simd Lane literal",No);
      break;
    case SimdShuffleOp:
      pSVar9 = cast<wabt::SimdShuffleOpExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)(pSVar9->opcode).enum_);
      pSVar52 = this->stream_;
      pSVar9 = cast<wabt::SimdShuffleOpExpr,wabt::Expr>(base);
      uVar51 = *(undefined8 *)(pSVar9->val).v;
      uVar50 = *(undefined8 *)((pSVar9->val).v + 8);
      pcVar46 = "Simd Lane[16] literal";
LAB_0013acad:
      value_00.v[8] = (char)uVar50;
      value_00.v[9] = (char)((ulong)uVar50 >> 8);
      value_00.v[10] = (char)((ulong)uVar50 >> 0x10);
      value_00.v[0xb] = (char)((ulong)uVar50 >> 0x18);
      value_00.v[0xc] = (char)((ulong)uVar50 >> 0x20);
      value_00.v[0xd] = (char)((ulong)uVar50 >> 0x28);
      value_00.v[0xe] = (char)((ulong)uVar50 >> 0x30);
      value_00.v[0xf] = (char)((ulong)uVar50 >> 0x38);
      value_00.v[0] = (char)uVar51;
      value_00.v[1] = (char)((ulong)uVar51 >> 8);
      value_00.v[2] = (char)((ulong)uVar51 >> 0x10);
      value_00.v[3] = (char)((ulong)uVar51 >> 0x18);
      value_00.v[4] = (char)((ulong)uVar51 >> 0x20);
      value_00.v[5] = (char)((ulong)uVar51 >> 0x28);
      value_00.v[6] = (char)((ulong)uVar51 >> 0x30);
      value_00.v[7] = (char)((ulong)uVar51 >> 0x38);
      Stream::WriteU128(pSVar52,value_00,pcVar46,No);
      break;
    case LoadSplat:
      pLVar16 = cast<wabt::LoadStoreExpr<(wabt::ExprType)44>,wabt::Expr>(base);
LAB_0013b445:
      WriteOpcode(this->stream_,(Opcode)(pLVar16->opcode).enum_);
      AVar37 = Opcode::GetAlignment(&pLVar16->opcode,pLVar16->align);
      pSVar52 = this->stream_;
      bVar5 = log2_u32((uint32_t)AVar37);
      Stream::WriteU8(pSVar52,(uint)bVar5,"alignment",No);
      pSVar52 = this->stream_;
      value = (uint32_t)pLVar16->offset;
      pcVar46 = "load offset";
      goto LAB_0013b682;
    case Store:
      pLVar36 = cast<wabt::LoadStoreExpr<(wabt::ExprType)45>,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)(pLVar36->opcode).enum_);
      AVar37 = Opcode::GetAlignment(&pLVar36->opcode,pLVar36->align);
      pSVar52 = this->stream_;
      bVar5 = log2_u32((uint32_t)AVar37);
      Stream::WriteU8(pSVar52,(uint)bVar5,"alignment",No);
      pSVar52 = this->stream_;
      value = (uint32_t)pLVar36->offset;
      pcVar46 = "store offset";
      goto LAB_0013b682;
    case TableCopy:
      pTVar48 = cast<wabt::TableCopyExpr,wabt::Expr>(base);
      IVar7 = Module::GetTableIndex(this->module_,&pTVar48->dst_table);
      IVar6 = Module::GetTableIndex(this->module_,&pTVar48->src_table);
      WriteOpcode(this->stream_,(Opcode)0xcc);
      WriteTableNumberWithReloc(this,IVar7,"table.copy dst_table");
      pcVar46 = "table.copy src_table";
      goto LAB_0013b757;
    case ElemDrop:
      pMVar1 = this->module_;
      pVVar11 = cast<wabt::VarExpr<(wabt::ExprType)47>,wabt::Expr>(base);
      value = Module::GetElemSegmentIndex(pMVar1,&pVVar11->var);
      WriteOpcode(this->stream_,(Opcode)0xcb);
      pSVar52 = this->stream_;
      pcVar46 = "elem.drop segment";
      goto LAB_0013b682;
    case TableInit:
      pTVar18 = cast<wabt::TableInitExpr,wabt::Expr>(base);
      IVar6 = Module::GetTableIndex(this->module_,&pTVar18->table_index);
      IVar7 = Module::GetElemSegmentIndex(this->module_,&pTVar18->segment_index);
      WriteOpcode(this->stream_,(Opcode)0xca);
      WriteU32Leb128(this->stream_,IVar7,"table.init segment");
      pcVar46 = "table.init table";
      goto LAB_0013b757;
    case TableGet:
      pMVar1 = this->module_;
      pVVar20 = cast<wabt::VarExpr<(wabt::ExprType)49>,wabt::Expr>(base);
      IVar6 = Module::GetTableIndex(pMVar1,&pVVar20->var);
      WriteOpcode(this->stream_,(Opcode)0xcd);
      pcVar46 = "table.get table index";
      goto LAB_0013b757;
    case TableGrow:
      pMVar1 = this->module_;
      pVVar8 = cast<wabt::VarExpr<(wabt::ExprType)50>,wabt::Expr>(base);
      IVar6 = Module::GetTableIndex(pMVar1,&pVVar8->var);
      WriteOpcode(this->stream_,(Opcode)0xcf);
      pcVar46 = "table.grow table index";
      goto LAB_0013b757;
    case TableSize:
      pMVar1 = this->module_;
      pVVar49 = cast<wabt::VarExpr<(wabt::ExprType)51>,wabt::Expr>(base);
      IVar6 = Module::GetTableIndex(pMVar1,&pVVar49->var);
      WriteOpcode(this->stream_,(Opcode)0xd0);
      pcVar46 = "table.size table index";
      goto LAB_0013b757;
    case TableSet:
      pMVar1 = this->module_;
      pVVar47 = cast<wabt::VarExpr<(wabt::ExprType)52>,wabt::Expr>(base);
      IVar6 = Module::GetTableIndex(pMVar1,&pVVar47->var);
      WriteOpcode(this->stream_,(Opcode)0xce);
      pcVar46 = "table.set table index";
      goto LAB_0013b757;
    case TableFill:
      pMVar1 = this->module_;
      pVVar10 = cast<wabt::VarExpr<(wabt::ExprType)53>,wabt::Expr>(base);
      IVar6 = Module::GetTableIndex(pMVar1,&pVVar10->var);
      WriteOpcode(this->stream_,(Opcode)0xd1);
      pcVar46 = "table.fill table index";
LAB_0013b757:
      WriteTableNumberWithReloc(this,IVar6,pcVar46);
      break;
    case Ternary:
      pSVar52 = this->stream_;
      pOVar40 = (OpcodeExpr<(wabt::ExprType)15> *)
                cast<wabt::OpcodeExpr<(wabt::ExprType)54>,wabt::Expr>(base);
      goto LAB_0013b647;
    case Throw:
      pcVar46 = (char *)0x8;
      WriteOpcode(this->stream_,(Opcode)0x8);
      pSVar52 = this->stream_;
      pVVar45 = cast<wabt::VarExpr<(wabt::ExprType)55>,wabt::Expr>(base);
      pcVar46 = Var::index(&pVVar45->var,pcVar46,__c_01);
      value = (uint32_t)pcVar46;
      pcVar46 = "throw event";
LAB_0013b682:
      WriteU32Leb128(pSVar52,value,pcVar46);
      break;
    case Try:
      pIVar12 = (IfExpr *)cast<wabt::TryExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)0x6);
      WriteBlockDecl(this,&(pIVar12->true_).decl);
      WriteExprList(this,func,&(pIVar12->true_).exprs);
      WriteOpcode(this->stream_,(Opcode)0x7);
LAB_0013b2bd:
      exprs_00 = &pIVar12->false_;
      goto LAB_0013b62f;
    case Unary:
      pSVar52 = this->stream_;
      pOVar40 = (OpcodeExpr<(wabt::ExprType)15> *)
                cast<wabt::OpcodeExpr<(wabt::ExprType)57>,wabt::Expr>(base);
LAB_0013b647:
      OVar53.enum_ = (pOVar40->opcode).enum_;
      goto LAB_0013b64d;
    case Last:
      pSVar52 = this->stream_;
      OVar53.enum_ = Unreachable;
LAB_0013b64d:
      WriteOpcode(pSVar52,OVar53);
    }
    intrusive_list<wabt::Expr>::const_iterator::operator++(&__begin2);
  } while( true );
}

Assistant:

void BinaryWriter::WriteExprList(const Func* func, const ExprList& exprs) {
  for (const Expr& expr : exprs) {
    WriteExpr(func, &expr);
  }
}